

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void deqp::gls::BuiltinPrecisionTests::Traits<float>::doPrintIVal
               (FloatFormat *fmt,Interval *ival,ostream *os)

{
  string local_40;
  ostream *local_20;
  ostream *os_local;
  Interval *ival_local;
  FloatFormat *fmt_local;
  
  local_20 = os;
  os_local = (ostream *)ival;
  ival_local = (Interval *)fmt;
  tcu::FloatFormat::intervalToHex_abi_cxx11_(&local_40,fmt,ival);
  std::operator<<(os,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat&	fmt,
										 const Interval&	ival,
										 ostream&			os)
	{
		os << fmt.intervalToHex(ival);
	}